

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_database.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalCopyDatabase::GetData
          (PhysicalCopyDatabase *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  byte bVar1;
  ClientContext *pCVar2;
  pointer puVar3;
  int iVar4;
  pointer pCVar5;
  Catalog *this_00;
  pointer pCVar6;
  Binder *info;
  type info_00;
  CreateFunctionInfo *info_01;
  CreateSequenceInfo *info_02;
  CreateTypeInfo *info_03;
  CreateViewInfo *info_04;
  CreateIndexInfo *info_05;
  TableCatalogEntry *pTVar7;
  undefined4 extraout_var;
  TableIOManager *args_2;
  AttachedDatabase *args_3;
  shared_ptr<duckdb::DataTableInfo,_true> *this_02;
  type table_info;
  NotImplementedException *this_03;
  CatalogType type;
  pointer puVar8;
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true> *this_04
  ;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  _Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false> local_110;
  ClientContext *local_108;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_100;
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
  *local_f8;
  string local_f0;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_a8 [120];
  DataTable *this_01;
  
  pCVar2 = context->client;
  this_04 = &this->info;
  pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->(this_04);
  this_00 = Catalog::GetCatalog(pCVar2,&pCVar5->target_database);
  local_f8 = this_04;
  pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->(this_04);
  puVar8 = (pCVar5->entries).
           super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pCVar5->entries).
           super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar8 == puVar3) {
      pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
               ::operator->(local_f8);
      puVar3 = (pCVar5->entries).
               super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (pCVar5->entries).
                    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1
          ) {
        if (((puVar8->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
             super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl != (CreateInfo *)0x0)
           && (pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                        ::operator->(puVar8), (pCVar6->super_ParseInfo).field_0x9 == '\x04')) {
          pCVar2 = context->client;
          info_05 = (CreateIndexInfo *)
                    unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->(puVar8);
          Catalog::CreateIndex(this_00,pCVar2,info_05);
          pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                   operator->(puVar8);
          pTVar7 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                             (this_00,context->client,&pCVar6->schema,(string *)(pCVar6 + 1),
                              (QueryErrorContext)0xffffffffffffffff);
          iVar4 = (*(pTVar7->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                    _vptr_CatalogEntry[0x10])(pTVar7);
          this_01 = (DataTable *)CONCAT44(extraout_var,iVar4);
          IndexStorageInfo::IndexStorageInfo
                    ((IndexStorageInfo *)&binder,(string *)&pCVar6[1].catalog.field_2);
          bound_info.
          super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
               (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                )((ulong)bound_info.
                         super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                         .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl
                 & 0xffffffffffffff00);
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<char_const(&)[15],bool>
                    (local_a8,(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)"v1_0_0_storage",&bound_info);
          (*(pCVar6->super_ParseInfo)._vptr_ParseInfo[3])(&local_100,pCVar6);
          args_2 = DataTable::GetTableIOManager(this_01);
          args_3 = Catalog::GetAttached(this_00);
          make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo&,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
                    ((duckdb *)&bound_info,
                     (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                      *)&local_100,(IndexStorageInfo *)&binder,args_2,args_3);
          if (local_100._M_head_impl != (CreateInfo *)0x0) {
            (*(code *)((__node_base_ptr)((local_100._M_head_impl)->super_ParseInfo)._vptr_ParseInfo)
                      [1]._M_nxt)();
          }
          local_110._M_head_impl =
               (BoundCreateTableInfo *)
               bound_info.
               super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
          bound_info.
          super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
               (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                )(__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
                  )0x0;
          DataTable::AddIndex(this_01,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                       *)&local_110);
          if ((_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)local_110._M_head_impl !=
              (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0) {
            (*(code *)((local_110._M_head_impl)->schema->super_InCatalogEntry).super_CatalogEntry.
                      oid)();
          }
          local_110._M_head_impl = (BoundCreateTableInfo *)0x0;
          this_02 = DataTable::GetDataTableInfo(this_01);
          table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator*(this_02);
          TableIndexList::InitializeIndexes
                    (&table_info->indexes,context->client,table_info,(char *)0x0);
          ::std::unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>::
          ~unique_ptr((unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>
                       *)&bound_info);
          IndexStorageInfo::~IndexStorageInfo((IndexStorageInfo *)&binder);
        }
      }
      return FINISHED;
    }
    pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->(puVar8);
    bVar1 = (pCVar6->super_ParseInfo).field_0x9;
    switch(bVar1) {
    case 1:
      Binder::CreateBinder
                ((Binder *)&binder,context->client,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      info = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      local_108 = (ClientContext *)
                  (puVar8->
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (puVar8->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      Binder::BindCreateTableInfo
                ((Binder *)&bound_info,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 info);
      if (local_108 != (ClientContext *)0x0) {
        (**(code **)((long)((ParseInfo *)
                           &local_108->super_enable_shared_from_this<duckdb::ClientContext>)->
                           _vptr_ParseInfo + 8))();
      }
      local_108 = (ClientContext *)0x0;
      pCVar2 = context->client;
      info_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*(&bound_info);
      Catalog::CreateTable(this_00,pCVar2,info_00);
      ::std::
      unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
      ~unique_ptr(&bound_info.
                   super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                 );
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      break;
    case 2:
      pCVar2 = context->client;
      pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->(puVar8);
      Catalog::CreateSchema(this_00,pCVar2,(CreateSchemaInfo *)pCVar6);
      break;
    case 3:
      pCVar2 = context->client;
      info_04 = (CreateViewInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(puVar8);
      Catalog::CreateView(this_00,pCVar2,info_04);
      break;
    case 4:
      break;
    case 5:
    case 7:
switchD_019fcac3_caseD_5:
      this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,"Entry type %s not supported in PhysicalCopyDatabase",
                 (allocator *)&bound_info);
      pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->(puVar8);
      CatalogTypeToString_abi_cxx11_
                (&local_f0,(duckdb *)(ulong)(byte)(pCVar6->super_ParseInfo).field_0x9,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_03,(string *)&binder,&local_f0);
      __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case 6:
      pCVar2 = context->client;
      info_02 = (CreateSequenceInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(puVar8);
      Catalog::CreateSequence(this_00,pCVar2,info_02);
      break;
    case 8:
      pCVar2 = context->client;
      info_03 = (CreateTypeInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(puVar8);
      Catalog::CreateType(this_00,pCVar2,info_03);
      break;
    default:
      if (1 < bVar1 - 0x1e) goto switchD_019fcac3_caseD_5;
      pCVar2 = context->client;
      info_01 = (CreateFunctionInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(puVar8);
      Catalog::CreateFunction(this_00,pCVar2,info_01);
    }
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

SourceResultType PhysicalCopyDatabase::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &catalog = Catalog::GetCatalog(context.client, info->target_database);
	for (auto &create_info : info->entries) {
		switch (create_info->type) {
		case CatalogType::SCHEMA_ENTRY:
			catalog.CreateSchema(context.client, create_info->Cast<CreateSchemaInfo>());
			break;
		case CatalogType::VIEW_ENTRY:
			catalog.CreateView(context.client, create_info->Cast<CreateViewInfo>());
			break;
		case CatalogType::SEQUENCE_ENTRY:
			catalog.CreateSequence(context.client, create_info->Cast<CreateSequenceInfo>());
			break;
		case CatalogType::TYPE_ENTRY:
			catalog.CreateType(context.client, create_info->Cast<CreateTypeInfo>());
			break;
		case CatalogType::MACRO_ENTRY:
		case CatalogType::TABLE_MACRO_ENTRY:
			catalog.CreateFunction(context.client, create_info->Cast<CreateMacroInfo>());
			break;
		case CatalogType::TABLE_ENTRY: {
			auto binder = Binder::CreateBinder(context.client);
			auto bound_info = binder->BindCreateTableInfo(std::move(create_info));
			catalog.CreateTable(context.client, *bound_info);
			break;
		}
		case CatalogType::INDEX_ENTRY: {
			// Skip for now.
			break;
		}
		default:
			throw NotImplementedException("Entry type %s not supported in PhysicalCopyDatabase",
			                              CatalogTypeToString(create_info->type));
		}
	}

	// Create the indexes after table creation.
	for (auto &create_info : info->entries) {
		if (!create_info || create_info->type != CatalogType::INDEX_ENTRY) {
			continue;
		}
		catalog.CreateIndex(context.client, create_info->Cast<CreateIndexInfo>());

		auto &create_index_info = create_info->Cast<CreateIndexInfo>();
		auto &table_entry =
		    catalog.GetEntry<TableCatalogEntry>(context.client, create_index_info.schema, create_index_info.table);
		auto &data_table = table_entry.GetStorage();

		IndexStorageInfo storage_info(create_index_info.index_name);
		storage_info.options.emplace("v1_0_0_storage", false);
		auto unbound_index = make_uniq<UnboundIndex>(create_index_info.Copy(), storage_info,
		                                             data_table.GetTableIOManager(), catalog.GetAttached());

		data_table.AddIndex(std::move(unbound_index));
		auto &data_table_info = *data_table.GetDataTableInfo();
		data_table_info.GetIndexes().InitializeIndexes(context.client, data_table_info);
	}

	return SourceResultType::FINISHED;
}